

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlglvideo.cpp
# Opt level: O3

void __thiscall
SDLGLFB::SDLGLFB(SDLGLFB *this,void *param_1,int width,int height,int param_4,int param_5,
                bool fullscreen)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  SDL_Window *pSVar4;
  SDL_GLContext pvVar5;
  SDLGLFB *this_00;
  undefined8 uVar6;
  FString caption;
  FString local_28;
  
  this_00 = this;
  DFrameBuffer::DFrameBuffer(&this->super_DFrameBuffer,width,height);
  (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00863600;
  this->m_Lock = 0;
  this->UpdatePending = false;
  SDLGLVideo::SetupPixelFormat((SDLGLVideo *)this_00,false,0);
  local_28.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  pcVar2 = GetVersionString();
  pcVar3 = GetGitTime();
  FString::Format(&local_28,"GZDOOM %s (%s)",pcVar2,pcVar3);
  uVar6 = 2;
  if (fullscreen) {
    uVar6 = 0x1003;
  }
  pSVar4 = (SDL_Window *)
           SDL_CreateWindow(local_28.Chars,vid_adapter.Value | 0x1fff0000U,
                            vid_adapter.Value | 0x1fff0000U,width,height,uVar6);
  this->Screen = pSVar4;
  if (pSVar4 != (SDL_Window *)0x0) {
    pvVar5 = (SDL_GLContext)SDL_GL_CreateContext(pSVar4);
    this->GLContext = pvVar5;
    if (pvVar5 != (SDL_GLContext)0x0) {
      iVar1 = SDL_GetWindowGammaRamp
                        (this->Screen,this->m_origGamma,this->m_origGamma + 1,this->m_origGamma + 2)
      ;
      this->m_supportsGamma = iVar1 != -1;
    }
  }
  FString::~FString(&local_28);
  return;
}

Assistant:

SDLGLFB::SDLGLFB (void *, int width, int height, int, int, bool fullscreen)
	: DFrameBuffer (width, height)
{
	int i;
	
	m_Lock=0;

	UpdatePending = false;
	
	if (!static_cast<SDLGLVideo*>(Video)->InitHardware(false, 0))
	{
		vid_renderer = 0;
		return;
	}

	FString caption;
	caption.Format(GAMESIG " %s (%s)", GetVersionString(), GetGitTime());
	Screen = SDL_CreateWindow (caption,
		SDL_WINDOWPOS_UNDEFINED_DISPLAY(vid_adapter), SDL_WINDOWPOS_UNDEFINED_DISPLAY(vid_adapter),
		width, height, (fullscreen ? SDL_WINDOW_FULLSCREEN_DESKTOP : 0)|SDL_WINDOW_OPENGL);

	if (Screen == NULL)
		return;

	GLContext = SDL_GL_CreateContext(Screen);
	if (GLContext == NULL)
		return;

	m_supportsGamma = -1 != SDL_GetWindowGammaRamp(Screen, m_origGamma[0], m_origGamma[1], m_origGamma[2]);
}